

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall IR::CharLiteral::~CharLiteral(CharLiteral *this)

{
  std::__cxx11::string::~string
            ((string *)
             &(this->
              super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              ).
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            );
  operator_delete(this,0x30);
  return;
}

Assistant:

const std::string& value() const { return std::get<0>(*this); }